

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O2

void __thiscall JtagAnalyzer::SetupResults(JtagAnalyzer *this)

{
  auto_ptr<JtagAnalyzerResults> *this_00;
  char cVar1;
  JtagAnalyzerResults *this_01;
  Channel aCStack_38 [16];
  
  this_01 = (JtagAnalyzerResults *)operator_new(0x50);
  JtagAnalyzerResults::JtagAnalyzerResults(this_01,this,&this->mSettings);
  this_00 = &this->mResults;
  std::auto_ptr<JtagAnalyzerResults>::reset(this_00,this_01);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  Channel::Channel(aCStack_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator!=(&(this->mSettings).mTdiChannel,aCStack_38);
  Channel::~Channel(aCStack_38);
  if (cVar1 != '\0') {
    AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)this_00->_M_ptr);
  }
  Channel::Channel(aCStack_38,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar1 = Channel::operator!=(&(this->mSettings).mTdoChannel,aCStack_38);
  Channel::~Channel(aCStack_38);
  if (cVar1 != '\0') {
    AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)this_00->_M_ptr);
  }
  return;
}

Assistant:

void JtagAnalyzer::SetupResults()
{
    mResults.reset( new JtagAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mTmsChannel );
    if( mSettings.mTdiChannel != UNDEFINED_CHANNEL )
        mResults->AddChannelBubblesWillAppearOn( mSettings.mTdiChannel );
    if( mSettings.mTdoChannel != UNDEFINED_CHANNEL )
        mResults->AddChannelBubblesWillAppearOn( mSettings.mTdoChannel );
}